

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_certificate_verify(ptls_t *tls,ptls_iovec_t message,char *context_string)

{
  uint8_t *puVar1;
  ushort uVar2;
  _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *p_Var3;
  ptls_key_schedule_t *ppVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  ulong unaff_RBP;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  ptls_hash_context_t **pppVar13;
  ptls_iovec_t pVar14;
  ptls_iovec_t pVar15;
  uint8_t signdata [226];
  uint8_t auStack_118 [232];
  
  sVar8 = message.len;
  puVar10 = message.base;
  if ((long)sVar8 < 6) {
    return 0x32;
  }
  uVar2 = *(ushort *)(puVar10 + 4);
  puVar11 = puVar10 + 6;
  puVar1 = puVar10 + sVar8;
  iVar6 = 0x32;
  if (1 < (ulong)((long)puVar1 - (long)puVar11)) {
    lVar9 = 0;
    unaff_RBP = 0;
    do {
      unaff_RBP = (ulong)puVar11[lVar9] | unaff_RBP << 8;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 2);
    puVar12 = puVar10 + 8;
    puVar11 = puVar12;
    if (unaff_RBP <= (ulong)((long)puVar1 - (long)puVar12)) {
      puVar11 = puVar12 + unaff_RBP;
      bVar5 = true;
      iVar6 = 0;
      goto LAB_001129cc;
    }
  }
  bVar5 = false;
  puVar12 = puVar11;
LAB_001129cc:
  if ((bVar5) && (iVar6 = 0x32, puVar11 == puVar1)) {
    sVar7 = build_certificate_verify_signdata(auStack_118,tls->key_schedule,context_string);
    p_Var3 = (tls->certificate_verify).cb;
    if (p_Var3 == (_func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *)0x0) {
      iVar6 = 0;
    }
    else {
      pVar14.len = unaff_RBP;
      pVar14.base = puVar12;
      pVar15.len = sVar7;
      pVar15.base = auStack_118;
      iVar6 = (*p_Var3)((tls->certificate_verify).verify_ctx,uVar2 << 8 | uVar2 >> 8,pVar15,pVar14);
    }
    (*ptls_clear_memory)(auStack_118,sVar7);
    (tls->certificate_verify).cb = (_func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t *)0x0;
    if (iVar6 == 0) {
      ppVar4 = tls->key_schedule;
      if (ppVar4->num_hashes == 0) {
        iVar6 = 0;
      }
      else {
        pppVar13 = &ppVar4->hashes[0].ctx;
        iVar6 = 0;
        sVar7 = 0;
        do {
          (*(*pppVar13)->update)(*pppVar13,puVar10,sVar8);
          sVar7 = sVar7 + 1;
          pppVar13 = pppVar13 + 2;
        } while (sVar7 != ppVar4->num_hashes);
      }
    }
  }
  return iVar6;
}

Assistant:

static int handle_certificate_verify(ptls_t *tls, ptls_iovec_t message, const char *context_string)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t algo;
    ptls_iovec_t signature;
    uint8_t signdata[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
    size_t signdata_size;
    int ret;

    /* decode */
    if ((ret = ptls_decode16(&algo, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        signature = ptls_iovec_init(src, end - src);
        src = end;
    });

    signdata_size = build_certificate_verify_signdata(signdata, tls->key_schedule, context_string);
    if (tls->certificate_verify.cb != NULL) {
        ret = tls->certificate_verify.cb(tls->certificate_verify.verify_ctx, algo, ptls_iovec_init(signdata, signdata_size),
                                         signature);
    } else {
        ret = 0;
    }
    ptls_clear_memory(signdata, signdata_size);
    tls->certificate_verify.cb = NULL;
    if (ret != 0) {
        goto Exit;
    }

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

Exit:
    return ret;
}